

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_InitFont(stbtt_fontinfo *info,uchar *data2,int fontstart)

{
  uint uVar1;
  ushort uVar2;
  stbtt_uint32 sVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  info->data = data2;
  info->fontstart = fontstart;
  sVar3 = stbtt__find_table(data2,fontstart,"cmap");
  sVar4 = stbtt__find_table(data2,fontstart,"loca");
  info->loca = sVar4;
  sVar5 = stbtt__find_table(data2,fontstart,"head");
  info->head = sVar5;
  sVar6 = stbtt__find_table(data2,fontstart,"glyf");
  info->glyf = sVar6;
  sVar7 = stbtt__find_table(data2,fontstart,"hhea");
  info->hhea = sVar7;
  sVar8 = stbtt__find_table(data2,fontstart,"hmtx");
  info->hmtx = sVar8;
  sVar9 = stbtt__find_table(data2,fontstart,"kern");
  info->kern = sVar9;
  iVar12 = 0;
  if ((sVar8 != 0 && sVar7 != 0) && ((sVar6 != 0 && sVar5 != 0) && (sVar4 != 0 && sVar3 != 0))) {
    sVar4 = stbtt__find_table(data2,fontstart,"maxp");
    if (sVar4 == 0) {
      uVar10 = 0xffff;
    }
    else {
      uVar10 = (uint)(ushort)(*(ushort *)(data2 + (ulong)sVar4 + 4) << 8 |
                             *(ushort *)(data2 + (ulong)sVar4 + 4) >> 8);
    }
    info->numGlyphs = uVar10;
    uVar2 = *(ushort *)(data2 + (ulong)sVar3 + 2) << 8 | *(ushort *)(data2 + (ulong)sVar3 + 2) >> 8;
    info->index_map = 0;
    if (uVar2 != 0) {
      uVar10 = sVar3 + 4;
      uVar11 = (ulong)uVar2;
      do {
        uVar2 = *(ushort *)(data2 + uVar10) << 8 | *(ushort *)(data2 + uVar10) >> 8;
        if ((uVar2 == 0) ||
           ((uVar2 == 3 &&
            ((uVar2 = *(ushort *)(data2 + (ulong)uVar10 + 2) << 8 |
                      *(ushort *)(data2 + (ulong)uVar10 + 2) >> 8, uVar2 == 10 || (uVar2 == 1))))))
        {
          uVar1 = *(uint *)(data2 + (ulong)uVar10 + 4);
          info->index_map =
               (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) +
               sVar3;
        }
        uVar10 = uVar10 + 8;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    if (info->index_map != 0) {
      info->indexToLocFormat =
           (uint)(ushort)(*(ushort *)(data2 + (long)(int)sVar5 + 0x32) << 8 |
                         *(ushort *)(data2 + (long)(int)sVar5 + 0x32) >> 8);
      iVar12 = 1;
    }
  }
  return iVar12;
}

Assistant:

STBTT_DEF int stbtt_InitFont(stbtt_fontinfo *info, const unsigned char *data2, int fontstart)
{
   stbtt_uint8 *data = (stbtt_uint8 *) data2;
   stbtt_uint32 cmap, t;
   stbtt_int32 i,numTables;

   info->data = data;
   info->fontstart = fontstart;

   cmap = stbtt__find_table(data, fontstart, "cmap");       // required
   info->loca = stbtt__find_table(data, fontstart, "loca"); // required
   info->head = stbtt__find_table(data, fontstart, "head"); // required
   info->glyf = stbtt__find_table(data, fontstart, "glyf"); // required
   info->hhea = stbtt__find_table(data, fontstart, "hhea"); // required
   info->hmtx = stbtt__find_table(data, fontstart, "hmtx"); // required
   info->kern = stbtt__find_table(data, fontstart, "kern"); // not required
   if (!cmap || !info->loca || !info->head || !info->glyf || !info->hhea || !info->hmtx)
      return 0;

   t = stbtt__find_table(data, fontstart, "maxp");
   if (t)
      info->numGlyphs = ttUSHORT(data+t+4);
   else
      info->numGlyphs = 0xffff;

   // find a cmap encoding table we understand *now* to avoid searching
   // later. (todo: could make this installable)
   // the same regardless of glyph.
   numTables = ttUSHORT(data + cmap + 2);
   info->index_map = 0;
   for (i=0; i < numTables; ++i) {
      stbtt_uint32 encoding_record = cmap + 4 + 8 * i;
      // find an encoding we understand:
      switch(ttUSHORT(data+encoding_record)) {
         case STBTT_PLATFORM_ID_MICROSOFT:
            switch (ttUSHORT(data+encoding_record+2)) {
               case STBTT_MS_EID_UNICODE_BMP:
               case STBTT_MS_EID_UNICODE_FULL:
                  // MS/Unicode
                  info->index_map = cmap + ttULONG(data+encoding_record+4);
                  break;
            }
            break;
        case STBTT_PLATFORM_ID_UNICODE:
            // Mac/iOS has these
            // all the encodingIDs are unicode, so we don't bother to check it
            info->index_map = cmap + ttULONG(data+encoding_record+4);
            break;
      }
   }
   if (info->index_map == 0)
      return 0;

   info->indexToLocFormat = ttUSHORT(data+info->head + 50);
   return 1;
}